

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O2

void TestAssign(void)

{
  bool bVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R8;
  char *in_R9;
  Bignum bignum2;
  Bignum bignum;
  char buffer [1024];
  
  bignum.used_bigits_ = 0;
  bignum.exponent_ = 0;
  bignum2.used_bigits_ = 0;
  bignum2.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&bignum,0);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x38,0xc0802c,(char *)(ulong)bVar1,(bool)in_CL);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x39,0xc08054,"0",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt16(&bignum,10);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x3b,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x3c,0xc0805f,"A",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt16(&bignum,0x20);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x3e,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x3f,0xc08065,"20",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt64(&bignum,0);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x43,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x44,0xc08054,"0",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt64(&bignum,10);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x46,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x47,0xc0805f,"A",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt64(&bignum,0x20);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x49,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x4a,0xc08065,"20",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt64(&bignum,0x100);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x4c,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x4d,0xc0806a,"100",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt64(&bignum,0x12345678);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x51,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x52,0xc08070,"12345678",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt64(&bignum,0xffffffffffffffff);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x56,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x57,0xc08084,"FFFFFFFFFFFFFFFF",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignUInt64(&bignum,0x123456789abcdef0);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x5b,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x5c,0xc08097,"123456789ABCDEF0",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  double_conversion::Bignum::AssignBignum(&bignum2,&bignum);
  bVar1 = double_conversion::Bignum::ToHexString(&bignum2,buffer,0x400);
  CheckHelper((char *)0x5f,0xc080bb,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x60,0xc08097,"123456789ABCDEF0",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignDecimalString(&bignum,"0");
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x63,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x64,0xc08054,"0",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignDecimalString(&bignum,"1");
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x67,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x68,0xc080e4,"1",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignDecimalString(&bignum,"1234567890");
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x6b,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x6c,0xc080f3,"499602D2",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"0");
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x6f,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  pcVar3 = buffer;
  CheckEqualsHelper((char *)0x70,0xc08054,"0",buffer,in_R8,in_R9);
  uVar2 = SUB81(pcVar3,0);
  AssignHexString(&bignum,"123456789ABCDEF0");
  bVar1 = double_conversion::Bignum::ToHexString(&bignum,buffer,0x400);
  CheckHelper((char *)0x73,0xc0802c,(char *)(ulong)bVar1,(bool)uVar2);
  CheckEqualsHelper((char *)0x74,0xc08097,"123456789ABCDEF0",buffer,in_R8,in_R9);
  return;
}

Assistant:

TEST(Assign) {
  char buffer[kBufferSize];
  Bignum bignum;
  Bignum bignum2;
  bignum.AssignUInt16(0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);
  bignum.AssignUInt16(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);
  bignum.AssignUInt16(0x20);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("20", buffer);


  bignum.AssignUInt64(0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);
  bignum.AssignUInt64(0xA);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);
  bignum.AssignUInt64(0x20);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("20", buffer);
  bignum.AssignUInt64(0x100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100", buffer);

  // The first real test, since this will not fit into one bigit.
  bignum.AssignUInt64(0x12345678);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("12345678", buffer);

  uint64_t big = DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF);
  bignum.AssignUInt64(big);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFFFF", buffer);

  big = DOUBLE_CONVERSION_UINT64_2PART_C(0x12345678, 9ABCDEF0);
  bignum.AssignUInt64(big);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);

  bignum2.AssignBignum(bignum);
  CHECK(bignum2.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);

  AssignDecimalString(&bignum, "0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignDecimalString(&bignum, "1");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  AssignDecimalString(&bignum, "1234567890");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("499602D2", buffer);

  AssignHexString(&bignum, "0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignHexString(&bignum, "123456789ABCDEF0");
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("123456789ABCDEF0", buffer);
}